

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createTexture_mix(SemanticParser *this,SP *in)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  float v;
  SP SVar5;
  SP tex;
  undefined4 in_stack_fffffffffffffb88;
  float in_stack_fffffffffffffb8c;
  ParamSet *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  ParamSet *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffbc0;
  string *name;
  ParamSet *in_stack_fffffffffffffbc8;
  ParamSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  SemanticParser *in_stack_fffffffffffffbe8;
  SemanticParser *this_02;
  float in_stack_fffffffffffffc2c;
  string *in_stack_fffffffffffffc30;
  ParamSet *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc68;
  allocator<char> *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc7c;
  string *in_stack_fffffffffffffc80;
  ParamSet *in_stack_fffffffffffffc88;
  allocator<char> local_301;
  string local_300 [32];
  vec3f local_2e0;
  allocator<char> local_2d1;
  string local_2d0 [39];
  undefined1 local_2a9 [40];
  allocator<char> local_281;
  string local_280 [71];
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [32];
  vec3f local_1f0;
  allocator<char> local_1e1;
  string local_1e0 [39];
  undefined1 local_1b9 [40];
  allocator<char> local_191;
  string local_190 [71];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [71];
  undefined1 local_d9 [33];
  vec3f local_b8;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [72];
  
  std::make_shared<pbrt::MixTexture>();
  std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1ac2e4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
             (allocator<char> *)in_stack_fffffffffffffbc0);
  bVar1 = syntactic::ParamSet::hasParam3f(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ac378);
    std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ac391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
               (allocator<char> *)in_stack_fffffffffffffbc0);
    syntactic::ParamSet::getParam3f
              ((ParamSet *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
               (float *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  else {
    std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ac4ad);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
               (allocator<char> *)in_stack_fffffffffffffbc0);
    bVar1 = syntactic::ParamSet::hasParam1f(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ac541);
      in_stack_fffffffffffffc80 = (string *)&peVar3->super_ParamSet;
      in_stack_fffffffffffffc88 = (ParamSet *)local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 (allocator<char> *)in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffc7c =
           syntactic::ParamSet::getParam1f
                     (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c)
      ;
      math::vec3f::vec3f(&local_b8,in_stack_fffffffffffffc7c);
      peVar4 = std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ac5c8);
      (peVar4->amount).x = local_b8.x;
      (peVar4->amount).y = local_b8.y;
      (peVar4->amount).z = local_b8.z;
      std::__cxx11::string::~string((string *)(local_d9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_d9);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ac69c);
      in_stack_fffffffffffffc68 = (string *)&peVar3->super_ParamSet;
      in_stack_fffffffffffffc70 = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 (allocator<char> *)in_stack_fffffffffffffbc0);
      syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      findOrCreateTexture(in_stack_fffffffffffffbe8,
                          (SP *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1ac726);
      std::shared_ptr<pbrt::Texture>::operator=
                ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffb90,
                 (shared_ptr<pbrt::Texture> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1ac747);
      std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Texture> *)0x1ac754);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
    }
  }
  std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1ac7eb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
             (allocator<char> *)in_stack_fffffffffffffbc0);
  bVar1 = syntactic::ParamSet::hasParamTexture(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  if (bVar1) {
    std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ac87f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
               (allocator<char> *)in_stack_fffffffffffffbc0);
    syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    findOrCreateTexture(in_stack_fffffffffffffbe8,
                        (SP *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
    std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ac909);
    std::shared_ptr<pbrt::Texture>::operator=
              ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffb90,
               (shared_ptr<pbrt::Texture> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1ac92a);
    std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)0x1ac937);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1aca18);
    in_stack_fffffffffffffc30 = (string *)&peVar3->super_ParamSet;
    in_stack_fffffffffffffc38 = (ParamSet *)local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
               (allocator<char> *)in_stack_fffffffffffffbc0);
    bVar1 = syntactic::ParamSet::hasParam3f(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    in_stack_fffffffffffffc2c = (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffc2c,0));
    std::__cxx11::string::~string((string *)(local_1b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1b9);
    if (((uint)in_stack_fffffffffffffc2c & 0x1000000) == 0) {
      std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1acbe1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 (allocator<char> *)in_stack_fffffffffffffbc0);
      v = syntactic::ParamSet::getParam1f
                    (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      math::vec3f::vec3f(&local_1f0,v);
      peVar4 = std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1acc5c);
      (peVar4->scale1).x = local_1f0.x;
      (peVar4->scale1).y = local_1f0.y;
      (peVar4->scale1).z = local_1f0.z;
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
    }
    else {
      std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1acaac);
      std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1acac5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 (allocator<char> *)in_stack_fffffffffffffbc0);
      syntactic::ParamSet::getParam3f
                ((ParamSet *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 (float *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
    }
  }
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1acce6);
  this_02 = (SemanticParser *)&peVar3->super_ParamSet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
             (allocator<char> *)in_stack_fffffffffffffbc0);
  bVar2 = syntactic::ParamSet::hasParamTexture(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  if ((bVar2 & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1acef5);
    name = (string *)&peVar3->super_ParamSet;
    this_00 = (ParamSet *)local_2a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbd0,(char *)this_00,(allocator<char> *)name);
    bVar1 = syntactic::ParamSet::hasParam3f(this_00,name);
    std::__cxx11::string::~string((string *)(local_2a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2a9);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1acf77);
      std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1acf8d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)this_00,(allocator<char> *)name);
      syntactic::ParamSet::getParam3f
                ((ParamSet *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 (float *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ad09a);
      in_stack_fffffffffffffb90 = &peVar3->super_ParamSet;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)this_00,(allocator<char> *)name);
      in_stack_fffffffffffffb8c =
           syntactic::ParamSet::getParam1f
                     (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c)
      ;
      math::vec3f::vec3f(&local_2e0,in_stack_fffffffffffffb8c);
      peVar4 = std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ad10f);
      (peVar4->scale2).x = local_2e0.x;
      (peVar4->scale2).y = local_2e0.y;
      (peVar4->scale2).z = local_2e0.z;
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator(&local_301);
    }
  }
  else {
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1acd68);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &peVar3->super_ParamSet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_stack_fffffffffffffbc8,
               (allocator<char> *)in_stack_fffffffffffffbc0);
    syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    findOrCreateTexture(this_02,(SP *)CONCAT17(bVar2,in_stack_fffffffffffffbe0));
    std::__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::MixTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1acde6);
    std::shared_ptr<pbrt::Texture>::operator=
              ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffb90,
               (shared_ptr<pbrt::Texture> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1ace07);
    std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)0x1ace14);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  std::shared_ptr<pbrt::Texture>::shared_ptr<pbrt::MixTexture,void>
            ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffb90,
             (shared_ptr<pbrt::MixTexture> *)
             CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::shared_ptr<pbrt::MixTexture>::~shared_ptr((shared_ptr<pbrt::MixTexture> *)0x1ad1ab);
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_mix(pbrt::syntactic::Texture::SP in)
  {
    MixTexture::SP tex = std::make_shared<MixTexture>();

    if (in->hasParam3f("amount"))
      in->getParam3f(&tex->amount.x,"amount");
    else if (in->hasParam1f("amount"))
      tex->amount = vec3f(in->getParam1f("amount"));
    else 
      tex->map_amount = findOrCreateTexture(in->getParamTexture("amount"));
          
    if (in->hasParamTexture("tex1"))
      tex->tex1 = findOrCreateTexture(in->getParamTexture("tex1"));
    else if (in->hasParam3f("tex1"))
      in->getParam3f(&tex->scale1.x,"tex1");
    else
      tex->scale1 = vec3f(in->getParam1f("tex1"));
          
    if (in->hasParamTexture("tex2"))
      tex->tex2 = findOrCreateTexture(in->getParamTexture("tex2"));
    else if (in->hasParam3f("tex2"))
      in->getParam3f(&tex->scale2.x,"tex2");
    else
      tex->scale2 = vec3f(in->getParam1f("tex2"));
    return tex;
  }